

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ast::InsideExpression::evalImpl(InsideExpression *this,EvalContext *context)

{
  bool bVar1;
  reference ppEVar2;
  InsideExpression *in_RSI;
  ConstantValue *in_RDI;
  ConstantValue cvr_1;
  ConstantValue cvr;
  logic_t result;
  Expression *elem;
  iterator __end2;
  iterator __begin2;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *__range2;
  bool anyUnknown;
  ConstantValue cvl;
  ConstantValue *in_stack_00000388;
  EvalContext *in_stack_00000390;
  ValueRangeExpression *in_stack_00000398;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe94;
  logic_t in_stack_fffffffffffffe95;
  undefined1 in_stack_fffffffffffffe96;
  logic_t in_stack_fffffffffffffe97;
  Expression *in_stack_fffffffffffffe98;
  undefined7 in_stack_fffffffffffffea0;
  logic_t in_stack_fffffffffffffea7;
  logic_t local_119 [24];
  logic_t local_101;
  ConstantValue *in_stack_ffffffffffffff00;
  ConstantValue *in_stack_ffffffffffffff08;
  logic_t local_89;
  Expression *local_88;
  Expression **local_80;
  __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
  local_78;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> local_70;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *local_60;
  byte local_51;
  uint local_50;
  
  left(in_RSI);
  Expression::eval(in_stack_fffffffffffffe98,
                   (EvalContext *)
                   CONCAT17(in_stack_fffffffffffffe97.value,
                            CONCAT16(in_stack_fffffffffffffe96,
                                     CONCAT15(in_stack_fffffffffffffe95.value,
                                              CONCAT14(in_stack_fffffffffffffe94,
                                                       in_stack_fffffffffffffe90)))));
  bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0xbd45b5);
  if (bVar1) {
    local_51 = 0;
    local_70 = rangeList(in_RSI);
    local_60 = &local_70;
    local_78._M_current =
         (Expression **)
         std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::begin
                   (in_stack_fffffffffffffe88);
    local_80 = (Expression **)
               std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::end
                         ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                          in_stack_fffffffffffffe98);
    while( true ) {
      bVar1 = __gnu_cxx::
              operator==<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                        ((__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                          *)CONCAT17(in_stack_fffffffffffffe97.value,
                                     CONCAT16(in_stack_fffffffffffffe96,
                                              CONCAT15(in_stack_fffffffffffffe95.value,
                                                       CONCAT14(in_stack_fffffffffffffe94,
                                                                in_stack_fffffffffffffe90)))),
                         (__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                          *)in_stack_fffffffffffffe88);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      ppEVar2 = __gnu_cxx::
                __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                ::operator*(&local_78);
      local_88 = *ppEVar2;
      logic_t::logic_t(&local_89);
      if (local_88->kind == ValueRange) {
        Expression::as<slang::ast::ValueRangeExpression>(local_88);
        ValueRangeExpression::checkInside(in_stack_00000398,in_stack_00000390,in_stack_00000388);
        bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0xbd470d);
        in_stack_fffffffffffffea7.value = bVar1;
        if (bVar1) {
          in_stack_fffffffffffffe98 =
               (Expression *)slang::ConstantValue::integer((ConstantValue *)0xbd476d);
          in_stack_fffffffffffffe97 =
               SVInt::operator_cast_to_logic_t((SVInt *)in_stack_fffffffffffffe88);
          local_89 = in_stack_fffffffffffffe97;
        }
        else {
          slang::ConstantValue::ConstantValue
                    ((ConstantValue *)
                     CONCAT17(in_stack_fffffffffffffe97.value,
                              CONCAT16(in_stack_fffffffffffffe96,
                                       CONCAT15(in_stack_fffffffffffffe95.value,
                                                CONCAT14(in_stack_fffffffffffffe94,
                                                         in_stack_fffffffffffffe90)))),
                     in_stack_fffffffffffffe88);
        }
        local_50 = (uint)!bVar1;
        slang::ConstantValue::~ConstantValue((ConstantValue *)0xbd47b5);
      }
      else {
        Expression::eval(in_stack_fffffffffffffe98,
                         (EvalContext *)
                         CONCAT17(in_stack_fffffffffffffe97.value,
                                  CONCAT16(in_stack_fffffffffffffe96,
                                           CONCAT15(in_stack_fffffffffffffe95.value,
                                                    CONCAT14(in_stack_fffffffffffffe94,
                                                             in_stack_fffffffffffffe90)))));
        bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0xbd47f7);
        in_stack_fffffffffffffe96 = bVar1;
        if (bVar1) {
          in_stack_fffffffffffffe95 =
               checkInsideMatch(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
          local_89 = in_stack_fffffffffffffe95;
        }
        else {
          slang::ConstantValue::ConstantValue
                    ((ConstantValue *)
                     CONCAT17(in_stack_fffffffffffffe97.value,
                              CONCAT16(bVar1,CONCAT15(in_stack_fffffffffffffe95.value,
                                                      CONCAT14(in_stack_fffffffffffffe94,
                                                               in_stack_fffffffffffffe90)))),
                     in_stack_fffffffffffffe88);
        }
        local_50 = (uint)!bVar1;
        slang::ConstantValue::~ConstantValue((ConstantValue *)0xbd4896);
      }
      if (local_50 != 0) goto LAB_00bd49f1;
      in_stack_fffffffffffffe94 =
           logic_t::operator_cast_to_bool
                     ((logic_t *)
                      CONCAT17(in_stack_fffffffffffffe97.value,
                               CONCAT16(in_stack_fffffffffffffe96,
                                        CONCAT15(in_stack_fffffffffffffe95.value,
                                                 CONCAT14(in_stack_fffffffffffffe94,
                                                          in_stack_fffffffffffffe90)))));
      if ((bool)in_stack_fffffffffffffe94) {
        logic_t::logic_t(&local_101,'\x01');
        SVInt::SVInt((SVInt *)in_stack_fffffffffffffe98,in_stack_fffffffffffffea7);
        slang::ConstantValue::ConstantValue
                  ((ConstantValue *)
                   CONCAT17(in_stack_fffffffffffffe97.value,
                            CONCAT16(in_stack_fffffffffffffe96,
                                     CONCAT15(in_stack_fffffffffffffe95.value,
                                              CONCAT14(in_stack_fffffffffffffe94,
                                                       in_stack_fffffffffffffe90)))),
                   (SVInt *)in_stack_fffffffffffffe88);
        SVInt::~SVInt((SVInt *)CONCAT17(in_stack_fffffffffffffea7.value,in_stack_fffffffffffffea0));
        local_50 = 1;
        goto LAB_00bd49f1;
      }
      bVar1 = logic_t::isUnknown(&local_89);
      in_stack_fffffffffffffe90 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe90);
      if (bVar1) {
        local_51 = 1;
      }
      __gnu_cxx::
      __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
      ::operator++(&local_78);
    }
    if ((local_51 & 1) == 0) {
      logic_t::logic_t(local_119,'\0');
    }
    else {
      local_119[0].value = 0x80;
    }
    SVInt::SVInt((SVInt *)in_stack_fffffffffffffe98,in_stack_fffffffffffffea7);
    slang::ConstantValue::ConstantValue
              ((ConstantValue *)
               CONCAT17(in_stack_fffffffffffffe97.value,
                        CONCAT16(in_stack_fffffffffffffe96,
                                 CONCAT15(in_stack_fffffffffffffe95.value,
                                          CONCAT14(in_stack_fffffffffffffe94,
                                                   in_stack_fffffffffffffe90)))),
               (SVInt *)in_stack_fffffffffffffe88);
    SVInt::~SVInt((SVInt *)CONCAT17(in_stack_fffffffffffffea7.value,in_stack_fffffffffffffea0));
    local_50 = 1;
  }
  else {
    slang::ConstantValue::ConstantValue
              ((ConstantValue *)
               CONCAT17(in_stack_fffffffffffffe97.value,
                        CONCAT16(in_stack_fffffffffffffe96,
                                 CONCAT15(in_stack_fffffffffffffe95.value,
                                          CONCAT14(in_stack_fffffffffffffe94,
                                                   in_stack_fffffffffffffe90)))),
               in_stack_fffffffffffffe88);
    local_50 = 1;
  }
LAB_00bd49f1:
  slang::ConstantValue::~ConstantValue((ConstantValue *)0xbd49fe);
  return in_RDI;
}

Assistant:

ConstantValue InsideExpression::evalImpl(EvalContext& context) const {
    ConstantValue cvl = left().eval(context);
    if (!cvl)
        return nullptr;

    bool anyUnknown = false;
    for (auto elem : rangeList()) {
        logic_t result;
        if (elem->kind == ExpressionKind::ValueRange) {
            ConstantValue cvr = elem->as<ValueRangeExpression>().checkInside(context, cvl);
            if (!cvr)
                return nullptr;

            result = (logic_t)cvr.integer();
        }
        else {
            ConstantValue cvr = elem->eval(context);
            if (!cvr)
                return nullptr;

            result = checkInsideMatch(cvl, cvr);
        }

        if (result)
            return SVInt(logic_t(true));

        if (result.isUnknown())
            anyUnknown = true;
    }

    return SVInt(anyUnknown ? logic_t::x : logic_t(0));
}